

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O2

void __thiscall
Memory::HeapBlockMap64::SetHeapBlockNoCheck
          (HeapBlockMap64 *this,void *address,size_t pageCount,HeapBlock *heapBlock,
          HeapBlockType blockType,byte bucketIndex)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  Node *pNVar4;
  uint uVar5;
  ulong uVar6;
  undefined8 *in_FS_OFFSET;
  
  uVar5 = 0x100000 - ((uint)((ulong)address >> 0xc) & 0xfffff);
  uVar6 = pageCount & 0xffffffff;
  if (uVar5 <= pageCount) {
    uVar6 = (ulong)uVar5;
  }
  puVar1 = (undefined4 *)*in_FS_OFFSET;
  do {
    pNVar4 = FindNode(this,address);
    if (pNVar4 == (Node *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar1 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                         ,0x4dc,"(node != nullptr)","node != nullptr");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar1 = 0;
    }
    HeapBlockMap32::SetHeapBlockNoCheck
              (&pNVar4->map,address,(uint)uVar6,heapBlock,blockType,bucketIndex);
    pageCount = pageCount - (uVar6 & 0xffffffff);
    address = (void *)((long)address + (uVar6 & 0xffffffff) * 0x1000);
    uVar6 = 0x100000;
    if (pageCount < 0x100000) {
      uVar6 = pageCount;
    }
  } while (pageCount != 0);
  return;
}

Assistant:

void
HeapBlockMap64::SetHeapBlockNoCheck(void * address, size_t pageCount, HeapBlock * heapBlock, HeapBlock::HeapBlockType blockType, byte bucketIndex)
{
    ForEachNodeInAddressRange(address, pageCount, [&](Node * node, void * address, uint nodePages)
    {
        Assert(node != nullptr);
        node->map.SetHeapBlockNoCheck(address, nodePages, heapBlock, blockType, bucketIndex);
    });
}